

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::InnerProduct3D_1D::forward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer ppTVar4;
  Tensor *pTVar5;
  Tensor *pTVar6;
  Assign assign;
  DefaultDevice local_99;
  type local_98;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_30;
  type local_20;
  
  ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar5 = *ppTVar4;
  if ((pTVar5->d).nd != 3) {
    __assert_fail("d.ndims() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                  ,0xc0,"const Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t() const");
  }
  pTVar6 = ppTVar4[1];
  if ((pTVar6->d).nd != 1) {
    __assert_fail("d.ndims() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                  ,0xb0,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t() const");
  }
  local_98.m_lhs_xpr.m_lhs_xpr.m_data = pTVar5->v;
  local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
       (long)(int)(pTVar5->d).d[0];
  local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
       (long)(int)(pTVar5->d).d[1];
  local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       (long)(int)(pTVar5->d).d[2];
  local_98.m_lhs_xpr.m_rhs_xpr.m_data = pTVar6->v;
  local_98.m_lhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
       (array<long,_1>)(long)(int)(pTVar6->d).d[0];
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 == 0x10) {
    local_98.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_98.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    if ((fx->d).nd != 2) {
LAB_001a47e3:
      local_98.m_lhs_xpr.m_indices._M_elems[0].second = 0;
      local_98.m_lhs_xpr.m_indices._M_elems[0].first = 2;
      __assert_fail("d.ndims() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xb4,"Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t()");
    }
    local_20.m_data = fx->v;
    local_30.m_lhs_xpr = &local_20;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(fx->d).d;
    local_20.m_dimensions.super_array<long,_2>._M_elems = (array<long,_2>)vpmovsxdq_avx(auVar1);
    local_30.m_rhs_xpr = &local_98;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>
           *)&local_30,&local_99);
  }
  else {
    pTVar5 = ppTVar4[2];
    if ((pTVar5->d).nd != 2) {
      __assert_fail("d.ndims() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xb8,"const Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t() const");
    }
    local_98.m_rhs_xpr.m_data = pTVar5->v;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(pTVar5->d).d;
    local_98.m_rhs_xpr.m_dimensions.super_array<long,_2>._M_elems =
         (array<long,_2>)vpmovsxdq_avx(auVar2);
    local_98.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_98.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    if ((fx->d).nd != 2) goto LAB_001a47e3;
    local_20.m_data = fx->v;
    local_30.m_lhs_xpr = &local_20;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(fx->d).d;
    local_20.m_dimensions.super_array<long,_2>._M_elems = (array<long,_2>)vpmovsxdq_avx(auVar3);
    local_30.m_rhs_xpr = &local_98;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run(&local_30,&local_99);
  }
  return;
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}